

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

void language::_formatStackVariable
               (QTextStream *str,char *className,QStringView varName,bool withInitParameters)

{
  long lVar1;
  Language LVar2;
  QTextStream *pQVar3;
  QStringView *in_RDX;
  char *in_RSI;
  QTextStream *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar2 = language();
  if (LVar2 == Cpp) {
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RDI,in_RSI);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
    QTextStream::operator<<(pQVar3,in_RDX);
    if ((in_R8B & 1) != 0) {
      QTextStream::operator<<(in_RDI,'(');
    }
  }
  else if (LVar2 == Python) {
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RDI,in_RDX);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," = ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,in_RSI);
    QTextStream::operator<<(pQVar3,'(');
    if ((in_R8B & 1) == 0) {
      QTextStream::operator<<(in_RDI,')');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void _formatStackVariable(QTextStream &str, const char *className, QStringView varName,
                          bool withInitParameters)
{
    switch (language()) {
    case Language::Cpp:
        str << className << ' ' << varName;
        if (withInitParameters)
            str << '(';
        break;
    case Language::Python:
        str << varName << " = " << className << '(';
        if (!withInitParameters)
            str << ')';
        break;
    }
}